

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O1

void __thiscall
CholeskyFactor::eliminate
          (CholeskyFactor *this,vector<double,_std::allocator<double>_> *m,HighsInt i,HighsInt j,
          HighsInt kmax,HighsInt currentk)

{
  int iVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  pointer pdVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  
  iVar9 = j * kmax;
  iVar1 = iVar9 + i;
  pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar10 = pdVar5[iVar1];
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    iVar6 = kmax * i;
    dVar13 = pdVar5[i + iVar6];
    dVar10 = dVar13 * dVar13 + dVar10 * dVar10;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar11._0_8_ = -pdVar5[iVar1];
      auVar11._8_8_ = pdVar5[i + iVar6];
      auVar12._8_8_ = dVar10;
      auVar12._0_8_ = dVar10;
      auVar12 = divpd(auVar11,auVar12);
    }
    else {
      auVar12 = ZEXT816(0x3ff0000000000000) << 0x40;
    }
    dVar10 = auVar12._0_8_;
    dVar13 = auVar12._8_8_;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        iVar3 = this->current_k;
        if (0 < (long)iVar3) {
          pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = 0;
          do {
            dVar2 = pdVar5[iVar6 + lVar7];
            pdVar5[iVar6 + lVar7] = dVar13 * dVar2 + pdVar5[iVar9 + lVar7] * -dVar10;
            pdVar5[iVar9 + lVar7] = dVar2 * dVar10 + pdVar5[iVar9 + lVar7] * dVar13;
            lVar7 = lVar7 + 1;
          } while (iVar3 != lVar7);
        }
      }
      else {
        uVar4 = this->current_k;
        if (dVar10 <= 0.0) {
          if (0 < (int)uVar4) {
            pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = 0;
            do {
              dVar10 = pdVar5[(long)iVar6 + uVar8];
              pdVar5[(long)iVar6 + uVar8] = pdVar5[(long)iVar9 + uVar8];
              pdVar5[(long)iVar9 + uVar8] = -dVar10;
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
        }
        else if (0 < (int)uVar4) {
          pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            dVar10 = pdVar5[(long)iVar6 + uVar8];
            pdVar5[(long)iVar6 + uVar8] = -pdVar5[(long)iVar9 + uVar8];
            pdVar5[(long)iVar9 + uVar8] = dVar10;
            uVar8 = uVar8 + 1;
          } while (uVar4 != uVar8);
        }
      }
    }
    else if ((dVar13 <= 0.0) && (iVar3 = this->current_k, 0 < (long)iVar3)) {
      pdVar5 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        pdVar5[iVar6 + lVar7] = -pdVar5[iVar6 + lVar7];
        pdVar5[iVar9 + lVar7] = -pdVar5[iVar9 + lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar3 != lVar7);
    }
    (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = 0.0;
  }
  return;
}

Assistant:

void eliminate(std::vector<double>& m, HighsInt i, HighsInt j, HighsInt kmax,
                 HighsInt currentk) {
    // i = col, j = row
    if (m[j * kmax + i] == 0.0) {
      return;
    }
    double z = sqrt(m[i * kmax + i] * m[i * kmax + i] +
                    m[j * kmax + i] * m[j * kmax + i]);
    double cos_, sin_;
    if (z == 0) {
      cos_ = 1.0;
      sin_ = 0.0;
    } else {
      cos_ = m[i * kmax + i] / z;
      sin_ = -m[j * kmax + i] / z;
    }

    if (sin_ == 0.0) {
      if (cos_ > 0.0) {
        // nothing
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -a_ik;
          m[j * kmax + k] = -m[j * kmax + k];
        }
      }
    } else if (cos_ == 0.0) {
      if (sin_ > 0.0) {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -m[j * kmax + k];
          m[j * kmax + k] = a_ik;
        }
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = m[j * kmax + k];
          m[j * kmax + k] = -a_ik;
        }
      }
    } else {
      // #pragma omp parallel for
      for (HighsInt k = 0; k < current_k; k++) {
        // update entry i and j of column k
        double a_ik = m[i * kmax + k];
        // entry i
        m[i * kmax + k] = cos_ * a_ik - sin_ * m[j * kmax + k];
        m[j * kmax + k] = sin_ * a_ik + cos_ * m[j * kmax + k];
      }
    }
    m[j * kmax + i] = 0.0;
  }